

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cc
# Opt level: O2

void __thiscall Thread::Join(Thread *this)

{
  void *val;
  ostream local_180 [376];
  
  if (this->running_ == false) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&val,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/thread.cc",
               0x20);
    std::operator<<(local_180,"Check failed: running_");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&val);
  }
  if (this->joinable_ == false) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&val,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/thread.cc",
               0x21);
    std::operator<<(local_180,"Check failed: joinable_");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&val);
  }
  pthread_join(this->pid_,&val);
  this->running_ = false;
  return;
}

Assistant:

void Thread::Join() {
  CHECK(running_);
  CHECK(joinable_);
  void *val;
  pthread_join(pid_, &val);
  running_ = 0;
}